

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O0

char get_FMchar(FMFieldPtr field,void *data)

{
  long in_RSI;
  long *in_RDI;
  
  if (*(int *)((long)in_RDI + 0xc) == 4) {
    return *(char *)(in_RSI + *in_RDI);
  }
  fprintf(_stderr,"Get Char failed on invalid data type!\n");
  exit(1);
}

Assistant:

extern char
get_FMchar(FMFieldPtr field, void *data)
{
    if (field->data_type == char_type) {
	return (char) *((char *) data + field->offset);
    } else {
	fprintf(stderr, "Get Char failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}